

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationLocalToParent
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *localpos,ChVector<double> *localspeed,ChVector<double> *localacc)

{
  ChQuaternion<double> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  ChVector<double> *v;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  ChQuaternion<double> local_1b0;
  ChQuaternion<double> local_190;
  ChQuaternion<double> local_170;
  undefined1 local_150 [24];
  double local_138;
  ChQuaternion<double> local_130;
  ChQuaternion<double> local_110;
  ChQuaternion<double> local_f0;
  ChQuaternion<double> local_d0;
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  ChMatrix33<double>::operator*(&(this->super_ChFrame<double>).Amatrix,localacc);
  dVar1 = (this->coord_dtdt).pos.m_data[2];
  this_00 = &(this->coord_dt).rot;
  local_90.m_data[0] = 0.0;
  local_90.m_data[1] = localpos->m_data[0];
  local_90.m_data[2] = localpos->m_data[1];
  local_90.m_data[3] = localpos->m_data[2];
  dVar2 = (this->coord_dtdt).pos.m_data[0];
  dVar3 = (this->coord_dtdt).pos.m_data[1];
  ChQuaternion<double>::operator%(&local_70,&(this->coord_dtdt).rot,&local_90);
  local_b0.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar5._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_b0.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_b0.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_b0.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_b0.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_b0.m_data[3] = (double)vmovlps_avx(auVar5);
  ChQuaternion<double>::operator%(&local_50,&local_70,&local_b0);
  local_110.m_data[0] = 0.0;
  local_110.m_data[1] = localpos->m_data[0];
  local_110.m_data[2] = localpos->m_data[1];
  local_110.m_data[3] = localpos->m_data[2];
  ChQuaternion<double>::operator%(&local_f0,this_00,&local_110);
  local_130.m_data[0] = (this->coord_dt).rot.m_data[0];
  auVar6._0_8_ = -(this->coord_dt).rot.m_data[3];
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  local_130.m_data[1]._0_4_ = *(undefined4 *)((this->coord_dt).rot.m_data + 1);
  local_130.m_data[2]._0_4_ = *(undefined4 *)((this->coord_dt).rot.m_data + 2);
  local_130.m_data[1]._4_4_ = *(uint *)((long)(this->coord_dt).rot.m_data + 0xc) ^ 0x80000000;
  local_130.m_data[2]._4_4_ = *(uint *)((long)(this->coord_dt).rot.m_data + 0x14) ^ 0x80000000;
  local_130.m_data[3] = (double)vmovlps_avx(auVar6);
  ChQuaternion<double>::operator%(&local_d0,&local_f0,&local_130);
  local_190.m_data[0] = 0.0;
  local_190.m_data[1] = localspeed->m_data[0];
  local_190.m_data[2] = localspeed->m_data[1];
  local_190.m_data[3] = localspeed->m_data[2];
  ChQuaternion<double>::operator%(&local_170,this_00,&local_190);
  local_1b0.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar7._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  local_1b0.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_1b0.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_1b0.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_1b0.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_1b0.m_data[3] = (double)vmovlps_avx(auVar7);
  ChQuaternion<double>::operator%((ChQuaternion<double> *)local_150,&local_170,&local_1b0);
  auVar4._8_8_ = 0x4010000000000000;
  auVar4._0_8_ = 0x4010000000000000;
  auVar4 = vmulpd_avx512vl(local_150._8_16_,auVar4);
  __return_storage_ptr__->m_data[0] =
       auVar4._0_8_ +
       local_d0.m_data[1] + local_d0.m_data[1] +
       local_50.m_data[1] + local_50.m_data[1] + dVar2 + local_1c8;
  __return_storage_ptr__->m_data[1] =
       auVar4._8_8_ +
       local_d0.m_data[2] + local_d0.m_data[2] +
       local_50.m_data[2] + local_50.m_data[2] + dVar3 + dStack_1c0;
  __return_storage_ptr__->m_data[2] =
       local_138 * 4.0 +
       local_d0.m_data[3] + local_d0.m_data[3] +
       local_50.m_data[3] + local_50.m_data[3] + dVar1 + local_1b8;
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointAccelerationLocalToParent(const ChVector<Real>& localpos,
                                                  const ChVector<Real>& localspeed,
                                                  const ChVector<Real>& localacc) const {
        return coord_dtdt.pos + this->Amatrix * localacc +
               ((coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localspeed) % this->coord.rot.GetConjugate()).GetVector() * 4);
    }